

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_script.cxx
# Opt level: O0

void __thiscall xray_re::se_monster::se_monster(se_monster *this)

{
  se_monster *this_local;
  
  cse_alife_monster_base::cse_alife_monster_base(&this->super_cse_alife_monster_base);
  *(undefined ***)
   &(this->super_cse_alife_monster_base).super_cse_alife_monster_abstract.
    super_cse_alife_creature_abstract = &PTR__se_monster_003905b0;
  *(undefined ***)
   &(this->super_cse_alife_monster_base).super_cse_alife_monster_abstract.
    super_cse_alife_creature_abstract.field_0x118 = &PTR__se_monster_00390618;
  (this->super_cse_alife_monster_base).super_cse_ph_skeleton._vptr_cse_ph_skeleton =
       (_func_int **)&PTR__se_monster_00390640;
  (this->super_cse_alife_monster_base).super_cse_ph_skeleton.field_0x2e = 0;
  (this->super_cse_alife_monster_base).super_cse_ph_skeleton.field_0x2f = 0;
  std::__cxx11::string::string((string *)&this->m_squad_id);
  this->m_sim_forced_online = false;
  std::__cxx11::string::string((string *)&this->m_off_level_vertex_id);
  std::__cxx11::string::string((string *)&this->m_active_section);
  return;
}

Assistant:

se_monster::se_monster(): m_job_online(0), m_was_in_smart_terrain(false),
	m_sim_forced_online(false) {}